

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

iterator * __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
::InnerMap::InsertUniqueInTree
          (iterator *__return_storage_ptr__,InnerMap *this,size_type b,Node *node)

{
  iterator *piVar1;
  LogMessage *other;
  pair<std::_Rb_tree_iterator<google::protobuf::internal::KeyView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>,_bool>
  pVar2;
  LogMessage local_78;
  Node *local_40;
  iterator *local_38;
  
  local_38 = __return_storage_ptr__;
  if (this->table_[b] != this->table_[b ^ 1]) {
    internal::LogMessage::LogMessage
              (&local_78,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/map.h"
               ,0x2fe);
    other = internal::LogMessage::operator<<
                      (&local_78,"CHECK failed: (table_[b]) == (table_[b ^ 1]): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_40,other);
    internal::LogMessage::~LogMessage(&local_78);
  }
  node->next = (Node *)0x0;
  local_40 = node;
  pVar2 = std::
          _Rb_tree<google::protobuf::internal::KeyView<std::__cxx11::string>*,google::protobuf::internal::KeyView<std::__cxx11::string>*,std::_Identity<google::protobuf::internal::KeyView<std::__cxx11::string>*>,google::protobuf::internal::DerefCompare<google::protobuf::internal::KeyView<std::__cxx11::string>>,google::protobuf::internal::MapAllocator<google::protobuf::internal::KeyView<std::__cxx11::string>*>>
          ::_M_insert_unique<google::protobuf::internal::KeyView<std::__cxx11::string>*>
                    ((_Rb_tree<google::protobuf::internal::KeyView<std::__cxx11::string>*,google::protobuf::internal::KeyView<std::__cxx11::string>*,std::_Identity<google::protobuf::internal::KeyView<std::__cxx11::string>*>,google::protobuf::internal::DerefCompare<google::protobuf::internal::KeyView<std::__cxx11::string>>,google::protobuf::internal::MapAllocator<google::protobuf::internal::KeyView<std::__cxx11::string>*>>
                      *)this->table_[b],
                     (KeyView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      **)&local_40);
  piVar1 = local_38;
  iterator_base<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>::KeyValuePair>
  ::iterator_base(local_38,(_Base_ptr)pVar2.first._M_node,this,b & 0xfffffffffffffffe);
  return piVar1;
}

Assistant:

iterator InsertUniqueInTree(size_type b, Node* node) {
      GOOGLE_DCHECK_EQ(table_[b], table_[b ^ 1]);
      // Maintain the invariant that node->next is null for all Nodes in Trees.
      node->next = nullptr;
      return iterator(
          static_cast<Tree*>(table_[b])->insert(KeyPtrFromNodePtr(node)).first,
          this, b & ~static_cast<size_t>(1));
    }